

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeCollapse(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                    int *pPermFanout)

{
  DdNode *n;
  Abc_Obj_t *pObj;
  int iVar1;
  long lVar2;
  
  if ((pFanin->pNtk->ntkFunc != ABC_FUNC_BDD) || (pFanin->pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pFanin->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x19e,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  if ((*(uint *)&pFanin->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x19f,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  if ((*(uint *)&pFanout->field_0x14 & 0xf) == 7) {
    n = Abc_NodeCollapseFunc(pFanin,pFanout,vFanins,pPermFanin,pPermFanout);
    if (n == (DdNode *)0x0) {
      iVar1 = 0;
    }
    else {
      Cudd_Ref(n);
      pObj = Abc_NtkCreateObj(pFanin->pNtk,ABC_OBJ_NODE);
      if (0 < vFanins->nSize) {
        lVar2 = 0;
        do {
          Abc_ObjAddFanin(pObj,(Abc_Obj_t *)vFanins->pArray[lVar2]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < vFanins->nSize);
      }
      (pObj->field_5).pData = n;
      Abc_NodeMinimumBase(pObj);
      Abc_ObjTransferFanout(pFanout,pObj);
      if ((pFanout->vFanouts).nSize != 0) {
        __assert_fail("Abc_ObjFanoutNum( pFanout ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                      ,0x1ae,
                      "int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
      }
      iVar1 = 1;
      Abc_NtkDeleteObj_rec(pFanout,1);
    }
    return iVar1;
  }
  __assert_fail("Abc_ObjIsNode(pFanout)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                ,0x1a0,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
}

Assistant:

int Abc_NodeCollapse( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Abc_Obj_t * pFanoutNew, * pObj;
    DdNode * bFanoutNew;
    int i;
    assert( Abc_NtkIsBddLogic(pFanin->pNtk) );
    assert( Abc_ObjIsNode(pFanin) );
    assert( Abc_ObjIsNode(pFanout) );
    bFanoutNew = Abc_NodeCollapseFunc( pFanin, pFanout, vFanins, pPermFanin, pPermFanout );  
    if ( bFanoutNew == NULL )
        return 0;
    Cudd_Ref( bFanoutNew );
    // create the new node
    pFanoutNew = Abc_NtkCreateNode( pFanin->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Abc_ObjAddFanin( pFanoutNew, pObj );
    pFanoutNew->pData = bFanoutNew;
    // minimize the node
    Abc_NodeMinimumBase( pFanoutNew );
    // transfer the fanout
    Abc_ObjTransferFanout( pFanout, pFanoutNew );
    assert( Abc_ObjFanoutNum( pFanout ) == 0 );
    Abc_NtkDeleteObj_rec( pFanout, 1 );
    return 1;
}